

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O1

xmlBufferPtr xmlBufferCreate(void)

{
  xmlBufferPtr pxVar1;
  xmlChar *pxVar2;
  
  pxVar1 = (xmlBufferPtr)(*xmlMalloc)(0x20);
  if (pxVar1 != (xmlBufferPtr)0x0) {
    pxVar1->use = 0;
    pxVar1->size = 0x100;
    pxVar1->alloc = XML_BUFFER_ALLOC_IO;
    pxVar2 = (xmlChar *)(*xmlMalloc)(0x100);
    pxVar1->contentIO = pxVar2;
    if (pxVar2 != (xmlChar *)0x0) {
      pxVar1->content = pxVar2;
      *pxVar2 = '\0';
      return pxVar1;
    }
    (*xmlFree)(pxVar1);
  }
  return (xmlBufferPtr)0x0;
}

Assistant:

xmlBufferPtr
xmlBufferCreate(void) {
    xmlBufferPtr ret;

    ret = xmlMalloc(sizeof(*ret));
    if (ret == NULL)
        return(NULL);

    ret->use = 0;
    ret->size = 256;
    ret->alloc = XML_BUFFER_ALLOC_IO;
    ret->contentIO = xmlMalloc(ret->size);
    if (ret->contentIO == NULL) {
	xmlFree(ret);
        return(NULL);
    }
    ret->content = ret->contentIO;
    ret->content[0] = 0;

    return(ret);
}